

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O2

void __thiscall unregistered_options::test_method(unregistered_options *this)

{
  __uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true> argv_00;
  options_boost_po *this_00;
  uint local_2a8 [2];
  undefined8 local_2a0;
  shared_count sStack_298;
  int argc;
  int int_opt;
  unique_ptr<char_*,_std::default_delete<char_*>_> argv;
  string local_280;
  string local_260;
  option_group_definition arg_group;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0 [8];
  char command_line [31];
  
  builtin_strncpy(command_line,"exe --int_opt 3 --str_opt test",0x1f);
  argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl =
       (__uniq_ptr_impl<char_*,_std::default_delete<char_*>_>)
       convert_to_command_args(command_line,&argc,0x40);
  argv._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl =
       (__uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true>)
       (__uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true>)
       argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
       super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  this_00 = (options_boost_po *)operator_new(0x2e8);
  VW::config::options_boost_po::options_boost_po
            (this_00,argc,
             (char **)argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
                      super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
                      super__Head_base<0UL,_char_**,_false>._M_head_impl);
  std::__cxx11::string::string((string *)&local_260,"group1",(allocator *)local_f8);
  VW::config::option_group_definition::option_group_definition(&arg_group,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::string((string *)&local_280,"int_opt",(allocator *)local_2a8);
  VW::config::typed_option<int>::typed_option((typed_option<int> *)local_f8,&local_280,&int_opt);
  VW::config::option_group_definition::add<VW::config::typed_option<int>>
            (&arg_group,(typed_option<int> *)local_f8);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)local_f8);
  std::__cxx11::string::~string((string *)&local_280);
  (**(this_00->super_options_i)._vptr_options_i)(this_00,&arg_group);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x14f);
  local_2a8[0] = CONCAT31(local_2a8[0]._1_3_,1);
  local_2a0 = 0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_f8[8] = 0;
  local_f8._0_8_ = &PTR__lazy_ostream_002e5ea8;
  local_f8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_e0[0]._M_allocated_capacity = "no exceptions thrown by options->add_and_parse(arg_group)";
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x150);
  local_f8[8] = 0;
  local_f8._0_8_ = &PTR__lazy_ostream_002e5760;
  local_f8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_e0[0]._M_allocated_capacity = (long)"%f\t" + 3;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_180 = "";
  local_2a8[0] = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_f8,&local_188,0x150,1,2,&int_opt,"int_opt",(allocator *)local_2a8,"3");
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x152);
  (*(this_00->super_options_i)._vptr_options_i[7])(this_00);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_1b0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x152);
  local_2a8[0] = local_2a8[0] & 0xffffff00;
  local_2a0 = 0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_f8[8] = 0;
  local_f8._0_8_ = &PTR__lazy_ostream_002e61c0;
  local_f8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_e0[0]._M_allocated_capacity = "exception VW::vw_exception expected but not raised";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  VW::config::option_group_definition::~option_group_definition(&arg_group);
  (*(this_00->super_options_i)._vptr_options_i[9])(this_00);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::~unique_ptr(&argv);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(unregistered_options) {
  int int_opt;

  char command_line[] = "exe --int_opt 3 --str_opt test";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group1");
  arg_group.add(make_option("int_opt", int_opt));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));
  BOOST_CHECK_EQUAL(int_opt, 3);

  BOOST_CHECK_THROW(options->check_unregistered(), VW::vw_exception);
}